

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O3

PATHFIND_DATA * new_path_data(void)

{
  PATHFIND_DATA *pPVar1;
  
  pPVar1 = (PATHFIND_DATA *)operator_new(0x50);
  pPVar1->room = (ROOM_INDEX_DATA *)0x0;
  pPVar1->evaluated = false;
  pPVar1->dir_from = -1;
  pPVar1->steps = -1;
  pPVar1->prev = (PATHFIND_DATA *)0x0;
  pPVar1->dir_to[0] = (PATHFIND_DATA *)0x0;
  pPVar1->dir_to[1] = (PATHFIND_DATA *)0x0;
  pPVar1->dir_to[2] = (PATHFIND_DATA *)0x0;
  pPVar1->dir_to[3] = (PATHFIND_DATA *)0x0;
  pPVar1->dir_to[4] = (PATHFIND_DATA *)0x0;
  pPVar1->dir_to[5] = (PATHFIND_DATA *)0x0;
  return pPVar1;
}

Assistant:

PATHFIND_DATA *new_path_data(void)
{
	PATHFIND_DATA *path = new PATHFIND_DATA;

	path->room = nullptr;
	path->evaluated= false;
	path->dir_from = -1;
	path->steps = -1;
	path->prev = nullptr;

	for (int i = 0; i < 6; i++)
	{
		path->dir_to[i] = nullptr;
	}

	return path;
}